

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS
ref_node_ratio_log_quadrature(REF_NODE ref_node,REF_INT node0,REF_INT node1,REF_DBL *ratio)

{
  double dVar1;
  REF_GLOB *pRVar2;
  REF_GLOB *pRVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  REF_DBL m [6];
  REF_DBL mlog [6];
  REF_DBL mlog1 [6];
  REF_DBL mlog0 [6];
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  REF_DBL local_a8;
  double adStack_a0 [18];
  
  *ratio = 0.0;
  lVar5 = (long)(node1 * 0xf);
  dVar8 = *(double *)(&ref_node->n + lVar5 * 2);
  dVar7 = *(double *)(&ref_node->blank + lVar5 * 2);
  lVar6 = (long)(node0 * 0xf);
  dVar9 = *(double *)(&ref_node->n + lVar6 * 2);
  dVar1 = *(double *)(&ref_node->blank + lVar6 * 2);
  pRVar2 = (&ref_node->global)[lVar5];
  pRVar3 = (&ref_node->global)[lVar6];
  lVar5 = 0;
  do {
    adStack_a0[lVar5 + 0xb] = *(double *)(&ref_node->n + (long)(node0 * 0xf + 9 + (int)lVar5) * 2);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 6);
  dVar7 = dVar7 - dVar1;
  lVar5 = 0;
  do {
    adStack_a0[lVar5 + 5] = *(double *)(&ref_node->n + (long)(node1 * 0xf + 9 + (int)lVar5) * 2);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 6);
  dVar8 = dVar8 - dVar9;
  lVar5 = 0;
  do {
    adStack_a0[lVar5 + -1] = adStack_a0[lVar5 + 0xb] * 0.5 + adStack_a0[lVar5 + 5] * 0.5;
    adStack_a0[lVar5] = adStack_a0[lVar5 + 0xc] * 0.5 + adStack_a0[lVar5 + 6] * 0.5;
    lVar5 = lVar5 + 2;
  } while (lVar5 != 6);
  uVar4 = ref_matrix_exp_m(&local_a8,&local_d8);
  if (uVar4 == 0) {
    dVar9 = (double)pRVar2 - (double)pRVar3;
    dVar8 = (local_b0 * dVar9 + local_c8 * dVar8 + dVar7 * local_b8) * dVar9 +
            (local_c8 * dVar9 + local_d8 * dVar8 + dVar7 * local_d0) * dVar8 +
            (local_b8 * dVar9 + local_d0 * dVar8 + local_c0 * dVar7) * dVar7;
    if (dVar8 < 0.0) {
      dVar8 = sqrt(dVar8);
    }
    else {
      dVar8 = SQRT(dVar8);
    }
    *ratio = dVar8 + *ratio;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x56c,
           "ref_node_ratio_log_quadrature",(ulong)uVar4,"exp");
  }
  return uVar4;
}

Assistant:

REF_FCN static REF_STATUS ref_node_ratio_log_quadrature(REF_NODE ref_node,
                                                        REF_INT node0,
                                                        REF_INT node1,
                                                        REF_DBL *ratio) {
  REF_DBL mlog0[6], mlog1[6];
  REF_DBL mlog[6], m[6];
  REF_DBL direction[3];
  REF_INT im;
  REF_DBL w0, w1;
  REF_INT i;

  /*
  REF_INT n = 3;
  REF_DBL x[] = {-sqrt(3.0 / 5.0), 0.0, sqrt(3.0 / 5.0)};
  REF_DBL w[] = {5.0 / 9.0, 8.0 / 9.0, 5.0 / 9.0};
  */
  REF_INT n = 1;
  REF_DBL x[] = {0.0};
  REF_DBL w[] = {2.0};

  *ratio = 0.0;

  direction[0] =
      (ref_node_xyz(ref_node, 0, node1) - ref_node_xyz(ref_node, 0, node0));
  direction[1] =
      (ref_node_xyz(ref_node, 1, node1) - ref_node_xyz(ref_node, 1, node0));
  direction[2] =
      (ref_node_xyz(ref_node, 2, node1) - ref_node_xyz(ref_node, 2, node0));
  RSS(ref_node_metric_get_log(ref_node, node0, mlog0), "node0 m");
  RSS(ref_node_metric_get_log(ref_node, node1, mlog1), "node1 m");

  for (i = 0; i < n; i++) {
    w1 = 0.5 * x[i] + 0.5;
    w0 = 1.0 - w1;
    for (im = 0; im < 6; im++) {
      mlog[im] = w0 * mlog0[im] + w1 * mlog1[im];
    }
    RSS(ref_matrix_exp_m(mlog, m), "exp");
    *ratio += 0.5 * w[i] * ref_matrix_sqrt_vt_m_v(m, direction);
  }

  return REF_SUCCESS;
}